

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QJsonValueRef * assignToRef(QJsonValueRef *ref,QCborValue *value,bool is_object)

{
  long lVar1;
  QJsonValueRef r;
  byte bVar2;
  bool bVar3;
  QCborContainerPrivate *pQVar4;
  byte in_DL;
  undefined8 extraout_RDX;
  qsizetype in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef r_00;
  qsizetype index;
  QCborContainerPrivate *d;
  ContainerDisposition disp;
  undefined7 in_stack_ffffffffffffffc0;
  Value *this;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  r.super_QJsonValueConstRef._8_8_ = in_RSI;
  r.super_QJsonValueConstRef.field_0.a =
       (QJsonArray *)(CONCAT17(in_DL,in_stack_ffffffffffffffc0) & 0x1ffffffffffffff);
  pQVar4 = QJsonPrivate::Value::container(r);
  disp = (ContainerDisposition)((ulong)pQVar4 >> 0x20);
  this = *(Value **)in_RDI;
  this_00 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)in_RDI->usedData;
  r_00._8_8_ = extraout_RDX;
  r_00.field_0.a = this_00.a;
  QJsonPrivate::Value::indexHelper(this,r_00);
  if (((bVar2 & 1) == 0) || (bVar3 = QCborValue::isUndefined((QCborValue *)0x4a20b9), !bVar3)) {
    QCborContainerPrivate::replaceAt
              (in_RDI,in_RSI,(QCborValue *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),disp);
  }
  else {
    QCborContainerPrivate::removeAt((QCborContainerPrivate *)this_00.a,(qsizetype)this);
    QCborContainerPrivate::removeAt((QCborContainerPrivate *)this_00.a,(qsizetype)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QJsonValueRef *)in_RDI;
}

Assistant:

static QJsonValueRef &assignToRef(QJsonValueRef &ref, const QCborValue &value, bool is_object)
{
    QCborContainerPrivate *d = QJsonPrivate::Value::container(ref);
    qsizetype index = QJsonPrivate::Value::indexHelper(ref);
    if (is_object && value.isUndefined()) {
        d->removeAt(index);
        d->removeAt(index - 1);
    } else {
        d->replaceAt(index, value);
    }

    return ref;
}